

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWebAssemblyTablePrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  RuntimeFunction **ppRVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  JavascriptMethod p_Var3;
  JavascriptFunction *pJVar4;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *prototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,6,0);
  this = RecyclableObject::GetLibrary(&prototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&prototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&this->webAssemblyTableConstructor);
  AddMember(this,prototype,0x67,*ppRVar2);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<18ul>(this,(char16 (*) [18])0x19956be);
    AddMember(this,prototype,0x1b,value,'\x02');
  }
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)WebAssemblyTable::EntryInfo::Grow);
  pJVar4 = AddFunctionToLibraryObject
                     (this,prototype,0xe4,(FunctionInfo *)WebAssemblyTable::EntryInfo::Grow,1,'\x06'
                     );
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)WebAssemblyTable::EntryInfo::Get);
  pJVar4 = AddFunctionToLibraryObject
                     (this,prototype,0x198,(FunctionInfo *)WebAssemblyTable::EntryInfo::Get,1,'\x06'
                     );
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var3,pJVar4);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)WebAssemblyTable::EntryInfo::Set);
  pJVar4 = AddFunctionToLibraryObject
                     (this,prototype,0x19b,(FunctionInfo *)WebAssemblyTable::EntryInfo::Set,2,'\x06'
                     );
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var3,pJVar4);
  AddAccessorsToLibraryObject
            (this,prototype,0xd1,(FunctionInfo *)WebAssemblyTable::EntryInfo::GetterLength,
             (FunctionInfo *)0x0);
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyTablePrototype(DynamicObject* prototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 6);

        JavascriptLibrary* library = prototype->GetLibrary();
        ScriptContext* scriptContext = prototype->GetScriptContext();

        library->AddMember(prototype, PropertyIds::constructor, library->webAssemblyTableConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(prototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly.Table")), PropertyConfigurable);
        }
        scriptContext->SetBuiltInLibraryFunction(WebAssemblyTable::EntryInfo::Grow.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::grow, &WebAssemblyTable::EntryInfo::Grow, 1));

        scriptContext->SetBuiltInLibraryFunction(WebAssemblyTable::EntryInfo::Get.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::get, &WebAssemblyTable::EntryInfo::Get, 1));

        scriptContext->SetBuiltInLibraryFunction(WebAssemblyTable::EntryInfo::Set.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::set, &WebAssemblyTable::EntryInfo::Set, 2));

        library->AddAccessorsToLibraryObject(prototype, PropertyIds::length, &WebAssemblyTable::EntryInfo::GetterLength, nullptr);

        prototype->SetHasNoEnumerableProperties(true);

        return true;
    }